

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O0

DS_STATUS ds_list_insert(DsList *list,int index,void *data)

{
  bool bVar1;
  DsListEntry *in_00;
  DsList *local_40;
  DsListEntry **entry;
  DS_STATUS status;
  DsListEntry *in;
  void *data_local;
  int index_local;
  DsList *list_local;
  
  if (list == (DsList *)0x0) {
    list_local._4_4_ = DS_STATUS_NULL;
  }
  else if ((index < 0) || (list->size < (ulong)(long)index)) {
    list_local._4_4_ = DS_STATUS_OUTMEM;
  }
  else {
    in_00 = (DsListEntry *)malloc(0x18);
    if (in_00 == (DsListEntry *)0x0) {
      list_local._4_4_ = DS_STATUS_OUTMEM;
    }
    else {
      in_00->data = data;
      in_00->next = (DsListEntry *)0x0;
      in_00->prev = (DsListEntry *)0x0;
      local_40 = list;
      data_local._4_4_ = index;
      while( true ) {
        bVar1 = false;
        if ((local_40->entry != (DsListEntry *)0x0) &&
           (bVar1 = false, local_40->entry->next != (DsListEntry *)0x0)) {
          bVar1 = 0 < data_local._4_4_;
        }
        if (!bVar1) break;
        data_local._4_4_ = data_local._4_4_ + -1;
        local_40 = (DsList *)&local_40->entry->next;
      }
      if ((long)data_local._4_4_ == list->size) {
        entry._4_4_ = ds_entry_append(&local_40->entry,in_00);
      }
      else {
        entry._4_4_ = ds_entry_prepend(&local_40->entry,in_00);
      }
      if (entry._4_4_ == DS_STATUS_OK) {
        list->size = list->size + 1;
        list_local._4_4_ = DS_STATUS_OK;
      }
      else {
        free(in_00);
        list_local._4_4_ = DS_STATUS_NULL;
      }
    }
  }
  return list_local._4_4_;
}

Assistant:

DS_STATUS ds_list_insert(DsList *list, int index, void *data)
{
    if (NULL == list)
        return DS_STATUS_NULL;
    if (index < 0 || index > list->size)
        return DS_STATUS_OUTMEM;

    DsListEntry *in = (DsListEntry *)malloc(sizeof(DsListEntry));
    if (NULL == in)
        return DS_STATUS_OUTMEM;
    in->data = data;
    in->next = NULL;
    in->prev = NULL;

    DS_STATUS status;

    // ! 这里需要获取list->entry的地址
    DsListEntry **entry = &list->entry;
    while ((*entry) && (*entry)->next && index > 0)
    {
        index--;
        // ! 需要改变的是entry的地址
        entry = &(*entry)->next;
    }

    if (index == list->size)
        status = ds_entry_append(entry, in);
    else
        status = ds_entry_prepend(entry, in);

    if (status != DS_STATUS_OK)
    {
        free(in);
        return DS_STATUS_NULL;
    }

    (list->size)++;
    return DS_STATUS_OK;
}